

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compute_sync_words.cc
# Opt level: O2

int main(int argc,char **argv)

{
  size_t sVar1;
  size_t sVar2;
  runtime_error *prVar3;
  int b;
  char *__format;
  int *in_R9;
  uint i_2;
  uint i;
  long lVar4;
  array<unsigned_char,_4UL> syncWord;
  array<unsigned_char,_4UL> nrzmSyncWord;
  string local_a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  char local_6c [4];
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf_1;
  Viterbi v;
  
  decoder::Viterbi::Viterbi(&v);
  syncWord._M_elems[0] = '\x1a';
  syncWord._M_elems[1] = 0xcf;
  syncWord._M_elems[2] = 0xfc;
  syncWord._M_elems[3] = '\x1d';
  sVar1 = correct_convolutional_sse_encode_len(v.v_,4);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&buf,sVar1,(allocator_type *)&local_a8);
  sVar2 = correct_convolutional_sse_encode
                    (v.v_,syncWord._M_elems,4,
                     buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start);
  if (sVar2 != sVar1) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    buf_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x31;
    util::str<char[33],char[107],char[2],int>
              (&local_a8,(util *)"Assertion `rv == len` failed at ",
               (char (*) [33])
               "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/src/decoder/compute_sync_words.cc"
               ,(char (*) [107])":",(char (*) [2])&buf_1,in_R9);
    std::runtime_error::runtime_error(prVar3,(string *)&local_a8);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  printf("LRIT:   phase 0: 0x");
  for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
    printf("%02x",(ulong)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start[lVar4]);
  }
  putchar(10);
  printf("LRIT: phase 180: 0x");
  for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
    printf("%02x",(ulong)(buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar4] ^ 0xff));
  }
  putchar(10);
  b = 0;
  while( true ) {
    if (b == 2) {
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      decoder::Viterbi::~Viterbi(&v);
      return 0;
    }
    nrzmSyncWord = nrzmEncode(syncWord,b);
    sVar1 = correct_convolutional_sse_encode_len(v.v_,4);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &buf_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>,sVar1,
               (allocator_type *)&local_a8);
    sVar2 = correct_convolutional_sse_encode
                      (v.v_,nrzmSyncWord._M_elems,4,
                       (uint8_t *)
                       CONCAT44(buf_1.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start._4_4_,
                                buf_1.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start._0_4_));
    if (sVar2 != sVar1) break;
    __format = "HRIT: phase 180: 0x";
    if (b == 0) {
      __format = "HRIT:   phase 0: 0x";
    }
    printf(__format);
    for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
      printf("%02x",(ulong)*(byte *)(CONCAT44(buf_1.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                              buf_1.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                    lVar4));
    }
    putchar(10);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&buf_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    b = b + 1;
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_6c[0] = 'I';
  local_6c[1] = '\0';
  local_6c[2] = '\0';
  local_6c[3] = '\0';
  util::str<char[33],char[107],char[2],int>
            (&local_a8,(util *)"Assertion `rv == len` failed at ",
             (char (*) [33])
             "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/src/decoder/compute_sync_words.cc"
             ,(char (*) [107])":",(char (*) [2])local_6c,in_R9);
  std::runtime_error::runtime_error(prVar3,(string *)&local_a8);
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main(int argc, char** argv) {
  decoder::Viterbi v;

  // Use array of bytes instead of fundamental type so we
  // don't need to worry about host byte order.
  std::array<uint8_t, 4> syncWord;
  syncWord[0] = 0x1A;
  syncWord[1] = 0xCF;
  syncWord[2] = 0xFC;
  syncWord[3] = 0x1D;

  // LRIT uses NRZ-L "coding" (which is really no coding at all).
  // To get the encoded sync word we can directly Viterbi encode it.
  // Then we can invert it to get its dual to deal with phase
  // ambiguity.
  auto len = v.encodeLength(syncWord.size());
  std::vector<uint8_t> buf(len);
  auto rv = v.encode(syncWord.data(), syncWord.size(), buf.data());
  ASSERT(rv == len);

  // 0 degree phase shift
  printf("LRIT:   phase 0: 0x");
  for (unsigned i = 0; i < 8; i++) {
    printf("%02x", (uint8_t) buf[i]);
  }
  printf("\n");

  // 180 degree phase shift
  printf("LRIT: phase 180: 0x");
  for (unsigned i = 0; i < 8; i++) {
    printf("%02x", (uint8_t) ~buf[i]);
  }
  printf("\n");

  // HRIT uses NRZ-M coding. In this scheme, a 0 means no bit change,
  // and a 1 means a bit change. We have to get an encoded sync word
  // for 2 different initial states to deal with phase ambiguity.
  for (unsigned i = 0; i < 2; i++) {
    auto nrzmSyncWord = nrzmEncode(syncWord, i);
    auto len = v.encodeLength(nrzmSyncWord.size());
    std::vector<uint8_t> buf(len);
    auto rv = v.encode(nrzmSyncWord.data(), nrzmSyncWord.size(), buf.data());
    ASSERT(rv == len);

    if (i == 0) {
      // 0 degree phase shift
      printf("HRIT:   phase 0: 0x");
    } else {
      // 180 degree phase shift
      printf("HRIT: phase 180: 0x");
    }
    for (unsigned i = 0; i < 8; i++) {
      printf("%02x", (uint8_t) buf[i]);
    }
    printf("\n");
  }
}